

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_insert.c
# Opt level: O0

void * mpt_buffer_insert(mpt_buffer *buf,size_t pos,size_t len)

{
  mpt_type_traits *pmVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  size_t local_60;
  size_t keep;
  size_t size;
  size_t total;
  size_t used;
  uint8_t *base;
  _func_int_void_ptr_void_ptr *init;
  mpt_type_traits *traits;
  size_t len_local;
  size_t pos_local;
  mpt_buffer *buf_local;
  
  total = buf->_used;
  if (pos < total) {
    size = total + len;
    local_60 = total - pos;
  }
  else {
    size = pos + len;
    local_60 = 0;
  }
  if (size == 0) {
    buf_local = buf + 1;
  }
  else if (buf->_size < size) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    buf_local = (mpt_buffer *)0x0;
  }
  else {
    uVar2 = (*buf->_vptr->get_flags)(buf);
    if ((uVar2 & 1) == 0) {
      keep = 0;
      base = (uint8_t *)0x0;
      pmVar1 = buf->_content_traits;
      if (pmVar1 != (mpt_type_traits *)0x0) {
        keep = pmVar1->size;
        if ((((keep == 0) || (total % keep != 0)) || (pos % keep != 0)) || (len % keep != 0)) {
          piVar4 = __errno_location();
          *piVar4 = 0x16;
          return (void *)0x0;
        }
        base = (uint8_t *)pmVar1->init;
      }
      buf->_used = size;
      if (local_60 != 0) {
        memmove((void *)((long)buf + ((size + 0x20) - local_60)),(void *)((long)&buf[1]._vptr + pos)
                ,local_60);
      }
      if (base != (uint8_t *)0x0) {
        while ((total < pos && (iVar3 = (*(code *)base)((long)&buf[1]._vptr + total), -1 < iVar3)))
        {
          total = keep + total;
        }
      }
      if (total < pos) {
        memset((void *)((long)&buf[1]._vptr + total),0,pos - total);
      }
      buf_local = (mpt_buffer *)((long)&buf[1]._vptr + pos);
    }
    else {
      piVar4 = __errno_location();
      *piVar4 = 0x5f;
      buf_local = (mpt_buffer *)0x0;
    }
  }
  return buf_local;
}

Assistant:

extern void *mpt_buffer_insert(MPT_STRUCT(buffer) *buf, size_t pos, size_t len)
{
	const MPT_STRUCT(type_traits) *traits;
	int (*init)(void *, const void *);
	uint8_t *base;
	size_t used, total, size, keep;
	
	/* need memory for inserted and existing data */
	used = buf->_used;
	if (pos < used) {
		total = used + len;
		keep = used - pos;
	} else {
		total = pos + len;
		keep = 0;
	}
	if (!total) {
		return buf + 1;
	}
	if (total > buf->_size) {
		errno = EINVAL;
		return 0;
	}
	if (MPT_ENUM(BufferImmutable) & buf->_vptr->get_flags(buf)) {
		errno = ENOTSUP;
		return 0;
	}
	/* require aligned values */
	size = 0;
	init = 0;
	if ((traits = buf->_content_traits)) {
		if (!(size = traits->size)
		    || used % size
		    || pos % size
		    || len % size) {
			errno = EINVAL;
			return 0;
		}
		init = traits->init;
	}
	base = (uint8_t *) (buf + 1);
	buf->_used = total;
	
	/* move data after insert position */
	if (keep) {
		memmove(base + total - keep, base + pos, keep);
	}
	/* init all new data */
	if (init) {
		while (used < pos) {
			if (init(base + used, 0) < 0) {
				break;
			}
			used += size;
		}
	}
	/* fill preceeding data */
	if (pos > used) {
		memset(base + used, 0, pos - used);
	}
	return base + pos;
}